

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t base64_decode(char *in,size_t inlen,uchar *out)

{
  byte bVar1;
  size_t sVar2;
  uchar uVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  
  if (inlen == 0) {
    return 0;
  }
  sVar5 = 0;
  iVar6 = 0;
  sVar2 = 0;
  do {
    uVar4 = (ulong)(byte)in[sVar5];
    if (uVar4 < 0x3e) {
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0x3d) {
          return sVar2;
        }
        goto LAB_00108829;
      }
      iVar6 = iVar6 + 1;
      goto LAB_00108819;
    }
LAB_00108829:
    bVar1 = base64de[uVar4];
    if (bVar1 == 0xff) {
      return 0;
    }
    switch((int)sVar5 - iVar6 & 3) {
    case 0:
      out[sVar2] = bVar1 << 2;
      break;
    case 1:
      out[sVar2] = out[sVar2] | bVar1 >> 4 & 3;
      uVar3 = bVar1 << 4;
      goto LAB_00108879;
    case 2:
      out[sVar2] = out[sVar2] | bVar1 >> 2 & 0xf;
      uVar3 = bVar1 << 6;
LAB_00108879:
      out[sVar2 + 1] = uVar3;
      sVar2 = sVar2 + 1;
      break;
    case 3:
      out[sVar2] = out[sVar2] | bVar1;
      sVar2 = sVar2 + 1;
    }
LAB_00108819:
    sVar5 = sVar5 + 1;
    if (inlen == sVar5) {
      return sVar2;
    }
  } while( true );
}

Assistant:

size_t base64_decode(const char* in, size_t inlen, unsigned char* out)
{
	size_t j = 0;
	size_t ignored = 0;

	for (size_t i = 0; i < inlen; i++)
	{
		if (in[i] == BASE64_PAD)
			break;

		if (in[i] == '\n' || in[i] == '\r' || in[i] == '\t' || in[i] == ' ')
		{
			ignored++;
			continue;
		}

		unsigned char c = base64de[(unsigned char)in[i]];

		if (c == 255)
			return 0;

		switch((i - ignored) & 0x3)
		{
			case 0:
				out[j] = (c << 2) & 0xFF;
				break;
			case 1:
				out[j++] |= (c >> 4) & 0x3;
				out[j] = (c & 0xF) << 4; 
				break;
			case 2:
				out[j++] |= (c >> 2) & 0xF;
				out[j] = (c & 0x3) << 6;
				break;
			case 3:
				out[j++] |= c;
				break;
		}
	}

	return j;
}